

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFModulusPoly.cpp
# Opt level: O0

ModulusPoly * __thiscall ZXing::Pdf417::ModulusPoly::multiply(ModulusPoly *this,int scalar)

{
  int iVar1;
  ModulusPoly *__a;
  reference pvVar2;
  int in_EDX;
  undefined8 *in_RSI;
  ModulusPoly *in_RDI;
  size_t i;
  vector<int,_std::allocator<int>_> product;
  size_t size;
  ModulusPoly *in_stack_ffffffffffffff68;
  ModulusPoly *in_stack_ffffffffffffff70;
  ModulusGF *this_00;
  ModulusPoly *this_01;
  ModulusPoly *local_58;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffd0;
  ModulusGF *in_stack_ffffffffffffffd8;
  ModulusPoly *this_02;
  
  if (in_EDX == 0) {
    ModulusGF::zero((ModulusGF *)*in_RSI);
    ModulusPoly(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  }
  else if (in_EDX == 1) {
    ModulusPoly(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  }
  else {
    this_01 = in_RDI;
    __a = (ModulusPoly *)
          std::vector<int,_std::allocator<int>_>::size
                    ((vector<int,_std::allocator<int>_> *)(in_RSI + 1));
    this_00 = (ModulusGF *)&stack0xffffffffffffffc7;
    this_02 = __a;
    std::allocator<int>::allocator((allocator<int> *)0x2cb3cb);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)this_01,(size_type)this_00,(allocator_type *)__a
              );
    std::allocator<int>::~allocator((allocator<int> *)0x2cb3eb);
    for (local_58 = (ModulusPoly *)0x0; local_58 < this_02;
        local_58 = (ModulusPoly *)((long)&local_58->_field + 1)) {
      std::vector<int,_std::allocator<int>_>::operator[]
                ((vector<int,_std::allocator<int>_> *)(in_RSI + 1),(size_type)local_58);
      iVar1 = ModulusGF::multiply(this_00,(int)((ulong)__a >> 0x20),(int)__a);
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)&stack0xffffffffffffffc8,
                          (size_type)local_58);
      *pvVar2 = iVar1;
    }
    ModulusPoly(this_02,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)__a);
  }
  return in_RDI;
}

Assistant:

ModulusPoly
ModulusPoly::multiply(int scalar) const
{
	if (scalar == 0) {
		return _field->zero();
	}
	if (scalar == 1) {
		return *this;
	}
	size_t size = _coefficients.size();
	std::vector<int> product(size);
	for (size_t i = 0; i < size; i++) {
		product[i] = _field->multiply(_coefficients[i], scalar);
	}
	return ModulusPoly(*_field, product);
}